

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-sw.c
# Opt level: O2

void aes_cbc_sw_decrypt(ssh_cipher *ciph,void *vblk,int blklen)

{
  ssh_cipheralg *psVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  ssh_cipher *psVar5;
  byte bVar6;
  int iVar7;
  BignumInt x_2;
  ulong uVar8;
  long lVar9;
  ulong __n;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  BignumInt x;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  BignumInt x_5;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  BignumInt x_3;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  BignumInt x_7;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  BignumInt x_4;
  ulong uVar36;
  ulong uVar37;
  uint8_t *vout;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  uint8_t data [64];
  
  data[0x30] = '\0';
  data[0x31] = '\0';
  data[0x32] = '\0';
  data[0x33] = '\0';
  data[0x34] = '\0';
  data[0x35] = '\0';
  data[0x36] = '\0';
  data[0x37] = '\0';
  data[0x38] = '\0';
  data[0x39] = '\0';
  data[0x3a] = '\0';
  data[0x3b] = '\0';
  data[0x3c] = '\0';
  data[0x3d] = '\0';
  data[0x3e] = '\0';
  data[0x3f] = '\0';
  data[0x20] = '\0';
  data[0x21] = '\0';
  data[0x22] = '\0';
  data[0x23] = '\0';
  data[0x24] = '\0';
  data[0x25] = '\0';
  data[0x26] = '\0';
  data[0x27] = '\0';
  data[0x28] = '\0';
  data[0x29] = '\0';
  data[0x2a] = '\0';
  data[0x2b] = '\0';
  data[0x2c] = '\0';
  data[0x2d] = '\0';
  data[0x2e] = '\0';
  data[0x2f] = '\0';
  data[0x10] = '\0';
  data[0x11] = '\0';
  data[0x12] = '\0';
  data[0x13] = '\0';
  data[0x14] = '\0';
  data[0x15] = '\0';
  data[0x16] = '\0';
  data[0x17] = '\0';
  data[0x18] = '\0';
  data[0x19] = '\0';
  data[0x1a] = '\0';
  data[0x1b] = '\0';
  data[0x1c] = '\0';
  data[0x1d] = '\0';
  data[0x1e] = '\0';
  data[0x1f] = '\0';
  data[0] = '\0';
  data[1] = '\0';
  data[2] = '\0';
  data[3] = '\0';
  data[4] = '\0';
  data[5] = '\0';
  data[6] = '\0';
  data[7] = '\0';
  data[8] = '\0';
  data[9] = '\0';
  data[10] = '\0';
  data[0xb] = '\0';
  data[0xc] = '\0';
  data[0xd] = '\0';
  data[0xe] = '\0';
  data[0xf] = '\0';
  for (uVar3 = (ulong)(blklen / 0x10); uVar3 != 0; uVar3 = uVar3 - uVar8) {
    uVar8 = 4;
    if (uVar3 < 4) {
      uVar8 = uVar3;
    }
    __n = (ulong)(uint)((int)uVar8 << 4);
    memcpy(data,vblk,__n);
    uVar10 = (((ulong)data._0_8_ >> 7 ^ data._0_8_) & 0xaa00aa00aa00aa) * 0x81 ^ data._0_8_;
    uVar4 = (((ulong)data._8_8_ >> 7 ^ data._8_8_) & 0xaa00aa00aa00aa) * 0x81 ^ data._8_8_;
    uVar10 = ((uVar10 >> 0xe ^ uVar10) & 0xcccc0000cccc) * 0x4001 ^ uVar10;
    uVar4 = ((uVar4 >> 0xe ^ uVar4) & 0xcccc0000cccc) * 0x4001 ^ uVar4;
    uVar10 = (ulong)(((uint)(uVar10 >> 0x1c) ^ (uint)uVar10) & 0xf0f0f0f0) * 0x10000001 ^ uVar10;
    uVar4 = (ulong)(((uint)(uVar4 >> 0x1c) ^ (uint)uVar4) & 0xf0f0f0f0) * 0x10000001 ^ uVar4;
    uVar21 = (uVar10 >> 8 ^ uVar4) & 0xff00ff00ff00ff;
    uVar10 = uVar21 << 8 ^ uVar10;
    uVar21 = uVar21 ^ uVar4;
    uVar19 = uVar10 & 0xffff;
    uVar22 = uVar10 >> 0x10 & 0xffff;
    uVar11 = uVar10 >> 0x20 & 0xffff;
    uVar10 = uVar10 >> 0x30;
    uVar25 = uVar21 & 0xffff;
    uVar29 = uVar21 >> 0x10 & 0xffff;
    uVar4 = uVar21 >> 0x20 & 0xffff;
    uVar21 = uVar21 >> 0x30;
    lVar9 = 0;
    while (lVar9 != 0x30) {
      uVar38 = *(ulong *)(data + lVar9 + 0x10);
      uVar12 = *(ulong *)(data + lVar9 + 0x18);
      uVar38 = ((uVar38 >> 7 ^ uVar38) & 0xaa00aa00aa00aa) * 0x81 ^ uVar38;
      uVar12 = ((uVar12 >> 7 ^ uVar12) & 0xaa00aa00aa00aa) * 0x81 ^ uVar12;
      uVar38 = ((uVar38 >> 0xe ^ uVar38) & 0xcccc0000cccc) * 0x4001 ^ uVar38;
      uVar12 = ((uVar12 >> 0xe ^ uVar12) & 0xcccc0000cccc) * 0x4001 ^ uVar12;
      uVar38 = (ulong)(((uint)(uVar38 >> 0x1c) ^ (uint)uVar38) & 0xf0f0f0f0) * 0x10000001 ^ uVar38;
      uVar12 = (ulong)(((uint)(uVar12 >> 0x1c) ^ (uint)uVar12) & 0xf0f0f0f0) * 0x10000001 ^ uVar12;
      uVar13 = (uVar38 >> 8 ^ uVar12) & 0xff00ff00ff00ff;
      uVar38 = uVar13 << 8 ^ uVar38;
      lVar9 = lVar9 + 0x10;
      bVar6 = (byte)lVar9;
      uVar13 = uVar13 ^ uVar12;
      uVar19 = uVar19 | (uVar38 & 0xffff) << (bVar6 & 0x3f);
      uVar22 = uVar22 | (uVar38 >> 0x10 & 0xffff) << (bVar6 & 0x3f);
      uVar11 = uVar11 | (uVar38 >> 0x20 & 0xffff) << (bVar6 & 0x3f);
      uVar10 = uVar10 | (uVar38 >> 0x30) << (bVar6 & 0x3f);
      uVar25 = uVar25 | (uVar13 & 0xffff) << (bVar6 & 0x3f);
      uVar29 = uVar29 | (uVar13 >> 0x10 & 0xffff) << (bVar6 & 0x3f);
      uVar4 = uVar4 | (uVar13 >> 0x20 & 0xffff) << (bVar6 & 0x3f);
      uVar21 = uVar21 | (uVar13 >> 0x30) << (bVar6 & 0x3f);
    }
    iVar7 = *(int *)&ciph[-0xc].vt;
    uVar38 = (ulong)(uint)(iVar7 * 8);
    uVar19 = uVar19 ^ (ulong)ciph[uVar38 - 0xa2].vt;
    uVar25 = uVar25 ^ (ulong)ciph[uVar38 - 0xa1].vt;
    uVar29 = uVar29 ^ (ulong)ciph[uVar38 - 0x9f].vt;
    uVar11 = uVar11 ^ (ulong)ciph[uVar38 - 0x9e].vt;
    uVar4 = uVar4 ^ (ulong)ciph[uVar38 - 0x9d].vt;
    uVar10 = uVar10 ^ (ulong)ciph[uVar38 - 0x9c].vt;
    uVar21 = uVar21 ^ (ulong)ciph[uVar38 - 0x9b].vt;
    uVar39 = uVar10 ^ uVar11;
    uVar13 = uVar11 ^ uVar29;
    uVar20 = uVar19 ^ uVar13;
    uVar12 = uVar39 ^ uVar19 ^ uVar25;
    uVar14 = uVar12 ^ uVar13;
    uVar10 = uVar21 ^ uVar10;
    uVar23 = uVar22 ^ (ulong)ciph[uVar38 - 0xa0].vt ^ uVar14 ^ uVar21;
    uVar17 = uVar14 ^ uVar21 ^ uVar29;
    uVar15 = uVar21 ^ uVar39;
    uVar26 = uVar12 ^ uVar4;
    uVar30 = uVar26 ^ uVar20;
    uVar18 = uVar10 ^ uVar29 ^ uVar19;
    uVar31 = uVar23 ^ uVar13 ^ uVar26;
    uVar16 = uVar31 ^ uVar15;
    uVar27 = (uVar23 ^ uVar13) & uVar13;
    uVar32 = (uVar16 ^ uVar30) & (uVar10 ^ uVar13) ^ uVar27;
    uVar27 = uVar18 & uVar10 ^ uVar27;
    uVar22 = uVar16 & uVar17;
    uVar34 = uVar31 & uVar12 ^ uVar29 ^ uVar19 ^ uVar27 ^ uVar22;
    uVar25 = uVar25 ^ uVar20;
    uVar29 = uVar30 & uVar25;
    uVar22 = (uVar21 ^ uVar11) & uVar15 ^ uVar23 ^ uVar22 ^ uVar32;
    uVar32 = uVar39 & uVar20 ^ uVar4 ^ uVar39 ^ uVar19 ^ uVar29 ^ uVar32;
    uVar27 = uVar14 & uVar26 ^ uVar4 ^ uVar29 ^ uVar13 ^ uVar27;
    uVar36 = uVar22 ^ uVar34;
    uVar22 = uVar22 & uVar32;
    uVar19 = (uVar22 ^ uVar27) & uVar36 ^ uVar34;
    uVar4 = (uVar34 ^ uVar22) & (uVar32 ^ uVar27);
    uVar29 = uVar4 ^ uVar27;
    uVar4 = (uVar4 ^ uVar22) & uVar27;
    uVar32 = uVar32 ^ uVar4;
    uVar36 = (uVar4 ^ uVar22 ^ uVar27) & uVar19 ^ uVar36;
    uVar22 = uVar32 ^ uVar29;
    uVar33 = uVar36 ^ uVar22;
    uVar21 = uVar22 & (uVar21 ^ uVar11);
    uVar28 = uVar19 ^ uVar29;
    uVar4 = uVar30 & (uVar36 ^ uVar19);
    uVar25 = (uVar36 ^ uVar19) & uVar25;
    uVar26 = uVar26 & uVar19;
    uVar40 = (uVar33 ^ uVar28) & (uVar10 ^ uVar13);
    uVar18 = uVar18 & uVar33;
    uVar23 = uVar36 & uVar39 ^ uVar18 ^ uVar28 & uVar23 ^ uVar25 ^ uVar40;
    uVar24 = uVar31 & uVar29 ^ uVar29 & uVar12;
    uVar34 = uVar23 ^ uVar4;
    uVar27 = uVar34 ^ uVar20 & uVar36;
    uVar23 = uVar23 ^ uVar16 & uVar32;
    uVar12 = uVar29 & uVar12 ^ uVar32 & uVar17 ^ uVar33 & uVar10;
    uVar34 = uVar34 ^ uVar26;
    uVar11 = uVar19 & uVar14 ^ uVar24 ^ uVar15 & uVar22 ^ uVar21 ^ uVar27;
    uVar27 = uVar18 ^ (uVar16 ^ uVar30) & (uVar33 ^ uVar28) ^ uVar27;
    uVar13 = uVar12 ^ uVar13 & uVar28;
    uVar14 = uVar36 & uVar39 ^ uVar11;
    uVar11 = uVar25 ^ uVar40 ^ uVar12 ^ uVar11;
    uVar19 = uVar31 & uVar29 ^ uVar23;
    uVar23 = uVar15 & uVar22 ^ uVar26 ^ uVar20 & uVar36 ^ uVar23;
    uVar4 = uVar24 ^ uVar26 ^ uVar16 & uVar32 ^ uVar21 ^ uVar33 & uVar10 ^ uVar4 ^ uVar40 ^ uVar27;
    uVar15 = (uVar34 >> 8 ^ uVar34) & 0xcc00cc00cc00cc;
    uVar16 = (uVar11 >> 8 ^ uVar11) & 0xcc00cc00cc00cc;
    uVar29 = (uVar14 >> 8 ^ uVar14) & 0xcc00cc00cc00cc;
    uVar12 = (uVar19 >> 8 ^ uVar19) & 0xcc00cc00cc00cc;
    uVar22 = (uVar4 >> 8 ^ uVar4) & 0xcc00cc00cc00cc;
    uVar25 = (uVar23 >> 8 ^ uVar23) & 0xcc00cc00cc00cc;
    uVar10 = (uVar27 >> 8 ^ uVar27) & 0xcc00cc00cc00cc;
    uVar21 = (uVar13 >> 8 ^ uVar13) & 0xcc00cc00cc00cc;
    uVar34 = (uVar15 << 8 | uVar15) ^ uVar34;
    uVar11 = (uVar16 << 8 | uVar16) ^ uVar11;
    uVar14 = (uVar29 << 8 | uVar29) ^ uVar14;
    uVar19 = (uVar12 << 8 | uVar12) ^ uVar19;
    uVar4 = (uVar22 << 8 | uVar22) ^ uVar4;
    uVar23 = (uVar25 << 8 | uVar25) ^ uVar23;
    uVar27 = (uVar10 << 8 | uVar10) ^ uVar27;
    uVar13 = (uVar21 << 8 | uVar21) ^ uVar13;
    uVar25 = uVar27 & 0x5555555555555555 | (uVar27 & 0xaaa0aaa0aaa0aaa) << 4 |
             uVar27 >> 0xc & 0xa000a000a000a;
    uVar22 = uVar13 & 0x5555555555555555 | (uVar13 & 0xaaa0aaa0aaa0aaa) << 4 |
             uVar13 >> 0xc & 0xa000a000a000a;
    uVar4 = uVar4 & 0x5555555555555555 | (uVar4 & 0xaaa0aaa0aaa0aaa) << 4 |
            uVar4 >> 0xc & 0xa000a000a000a;
    uVar29 = uVar23 & 0x5555555555555555 | (uVar23 & 0xaaa0aaa0aaa0aaa) << 4 |
             uVar23 >> 0xc & 0xa000a000a000a;
    uVar21 = uVar14 & 0x5555555555555555 | (uVar14 & 0xaaa0aaa0aaa0aaa) << 4 |
             uVar14 >> 0xc & 0xa000a000a000a;
    uVar10 = uVar19 & 0x5555555555555555 | (uVar19 & 0xaaa0aaa0aaa0aaa) << 4 |
             uVar19 >> 0xc & 0xa000a000a000a;
    uVar19 = uVar34 & 0x5555555555555555 | (uVar34 & 0xaaa0aaa0aaa0aaa) << 4 |
             uVar34 >> 0xc & 0xa000a000a000a;
    uVar11 = uVar11 & 0x5555555555555555 | (uVar11 & 0xaaa0aaa0aaa0aaa) << 4 |
             uVar11 >> 0xc & 0xa000a000a000a;
    psVar5 = ciph + (uVar38 - 0xa3);
    while( true ) {
      iVar7 = iVar7 + -1;
      uVar22 = uVar22 ^ (ulong)psVar5[-7].vt;
      uVar25 = uVar25 ^ (ulong)psVar5[-6].vt;
      uVar29 = uVar29 ^ (ulong)psVar5[-5].vt;
      uVar4 = uVar4 ^ (ulong)psVar5[-4].vt;
      uVar10 = uVar10 ^ (ulong)psVar5[-3].vt;
      uVar21 = uVar21 ^ (ulong)psVar5[-2].vt;
      uVar11 = uVar11 ^ (ulong)psVar5[-1].vt;
      uVar19 = uVar19 ^ (ulong)psVar5->vt;
      if (iVar7 == 0) break;
      uVar30 = uVar19 ^ uVar29;
      uVar12 = uVar19 ^ uVar22;
      uVar18 = uVar11 ^ uVar25;
      uVar38 = uVar12 ^ uVar30 ^ uVar21 ^ uVar4 ^ uVar18;
      uVar13 = uVar19 ^ uVar4;
      uVar20 = uVar19 ^ uVar11;
      uVar16 = uVar11 ^ uVar21;
      uVar35 = (uVar12 >> 1 & 0x7777777777777777 | uVar12 * 8 & 0x8888888888888888) ^ uVar12;
      uVar37 = (uVar12 >> 2 & 0x3333333333333333 | uVar12 * 4 & 0xcccccccccccccccc) ^ uVar12;
      uVar28 = uVar12 ^ uVar16;
      uVar34 = uVar12 ^ uVar25 ^ uVar20;
      uVar32 = uVar34 ^ uVar16;
      uVar16 = uVar10 ^ uVar13 ^ uVar16;
      uVar28 = (uVar28 >> 1 & 0x7777777777777777 | uVar28 * 8 & 0x8888888888888888) ^ uVar28;
      uVar32 = (uVar32 >> 1 & 0x7777777777777777 | uVar32 * 8 & 0x8888888888888888) ^ uVar32;
      uVar34 = uVar34 ^ uVar29;
      uVar34 = (uVar34 >> 1 & 0x7777777777777777 | uVar34 * 8 & 0x8888888888888888) ^ uVar34;
      uVar38 = (uVar38 >> 1 & 0x7777777777777777 | uVar38 * 8 & 0x8888888888888888) ^ uVar38;
      uVar12 = (uVar30 >> 1 & 0x7777777777777777 | uVar30 * 8 & 0x8888888888888888) ^ uVar30;
      uVar30 = uVar30 ^ uVar11;
      uVar26 = (uVar13 >> 1 & 0x7777777777777777 | uVar13 * 8 & 0x8888888888888888) ^ uVar13;
      uVar36 = (uVar13 >> 2 & 0x3333333333333333 | uVar13 * 4 & 0xcccccccccccccccc) ^ uVar13;
      uVar13 = uVar13 ^ uVar21 ^ uVar10 ^ uVar30;
      uVar40 = (uVar13 >> 1 & 0x7777777777777777 | uVar13 * 8 & 0x8888888888888888) ^ uVar13;
      uVar13 = uVar13 ^ uVar18;
      uVar13 = (uVar13 >> 1 & 0x7777777777777777 | uVar13 * 8 & 0x8888888888888888) ^ uVar13;
      uVar16 = (uVar16 >> 1 & 0x7777777777777777 | uVar16 * 8 & 0x8888888888888888) ^ uVar16;
      uVar14 = uVar21 ^ uVar10 ^ uVar20;
      uVar14 = (uVar14 >> 1 & 0x7777777777777777 | uVar14 * 8 & 0x8888888888888888) ^ uVar14;
      uVar20 = (uVar20 >> 2 & 0x3333333333333333 | uVar20 * 4 & 0xcccccccccccccccc) ^ uVar20;
      uVar27 = (uVar25 >> 1 & 0x7777777777777777 | uVar25 * 8 & 0x8888888888888888) ^ uVar25;
      uVar17 = (uVar10 >> 1 & 0x7777777777777777 | uVar10 * 8 & 0x8888888888888888) ^ uVar10;
      uVar23 = (uVar19 >> 1 & 0x7777777777777777 | uVar19 * 8 & 0x8888888888888888) ^ uVar19;
      uVar31 = (uVar21 >> 1 & 0x7777777777777777 | uVar21 * 8 & 0x8888888888888888) ^ uVar21;
      uVar33 = (uVar11 >> 1 & 0x7777777777777777 | uVar11 * 8 & 0x8888888888888888) ^ uVar11;
      uVar18 = (uVar18 >> 2 & 0x3333333333333333 | uVar18 * 4 & 0xcccccccccccccccc) ^ uVar18;
      uVar30 = (uVar30 >> 2 & 0x3333333333333333 | uVar30 * 4 & 0xcccccccccccccccc) ^ uVar30;
      uVar24 = (uVar21 >> 2 & 0x3333333333333333 | uVar21 * 4 & 0xcccccccccccccccc) ^ uVar21;
      uVar39 = (uVar11 >> 2 & 0x3333333333333333 | uVar11 * 4 & 0xcccccccccccccccc) ^ uVar11;
      uVar15 = (uVar10 >> 2 & 0x3333333333333333 | uVar10 * 4 & 0xcccccccccccccccc) ^ uVar10;
      uVar28 = (uVar39 >> 1 & 0x7777777777777777 | uVar39 * 8 & 0x8888888888888888) ^
               (uVar23 >> 2 & 0x3333333333333333 | uVar23 * 4 & 0xcccccccccccccccc) ^ uVar22 ^
               (uVar28 >> 2 & 0x3333333333333333 | uVar28 * 4 & 0xcccccccccccccccc) ^ uVar28;
      uVar20 = (uVar20 >> 1 & 0x7777777777777777 | uVar20 * 8 & 0x8888888888888888) ^
               (uVar35 >> 2 & 0x3333333333333333 | uVar35 * 4 & 0xcccccccccccccccc) ^ uVar25 ^
               uVar32 ^ (uVar32 >> 2 & 0x3333333333333333 | uVar32 * 4 & 0xcccccccccccccccc);
      uVar38 = (uVar18 >> 1 & 0x7777777777777777 | uVar18 * 8 & 0x8888888888888888) ^
               (uVar12 >> 2 & 0x3333333333333333 | uVar12 * 4 & 0xcccccccccccccccc) ^ uVar4 ^
               (uVar38 >> 2 & 0x3333333333333333 | uVar38 * 4 & 0xcccccccccccccccc) ^ uVar38;
      uVar13 = (uVar30 >> 1 & 0x7777777777777777 | uVar30 * 8 & 0x8888888888888888) ^
               (uVar26 >> 2 & 0x3333333333333333 | uVar26 * 4 & 0xcccccccccccccccc) ^ uVar10 ^
               (uVar13 >> 2 & 0x3333333333333333 | uVar13 * 4 & 0xcccccccccccccccc) ^ uVar13;
      uVar26 = (uVar36 >> 1 & 0x7777777777777777 | uVar36 * 8 & 0x8888888888888888) ^
               (uVar17 >> 2 & 0x3333333333333333 | uVar17 * 4 & 0xcccccccccccccccc) ^ uVar21 ^
               uVar40 ^ (uVar40 >> 2 & 0x3333333333333333 | uVar40 * 4 & 0xcccccccccccccccc);
      uVar16 = (uVar15 >> 1 & 0x7777777777777777 | uVar15 * 8 & 0x8888888888888888) ^
               (uVar31 >> 2 & 0x3333333333333333 | uVar31 * 4 & 0xcccccccccccccccc) ^ uVar11 ^
               (uVar16 >> 2 & 0x3333333333333333 | uVar16 * 4 & 0xcccccccccccccccc) ^ uVar16;
      uVar14 = (uVar24 >> 1 & 0x7777777777777777 | uVar24 * 8 & 0x8888888888888888) ^
               (uVar33 >> 2 & 0x3333333333333333 | uVar33 * 4 & 0xcccccccccccccccc) ^ uVar19 ^
               (uVar14 >> 2 & 0x3333333333333333 | uVar14 * 4 & 0xcccccccccccccccc) ^ uVar14;
      uVar17 = uVar13 ^ uVar16;
      uVar24 = uVar17 ^ uVar28 ^ uVar20;
      uVar22 = uVar13 ^ uVar38;
      uVar18 = uVar24 ^ uVar22;
      uVar25 = (uVar37 >> 1 & 0x7777777777777777 | uVar37 * 8 & 0x8888888888888888) ^
               (uVar27 >> 2 & 0x3333333333333333 | uVar27 * 4 & 0xcccccccccccccccc) ^ uVar29 ^
               uVar34 ^ (uVar34 >> 2 & 0x3333333333333333 | uVar34 * 4 & 0xcccccccccccccccc) ^
               uVar18 ^ uVar14;
      uVar23 = uVar18 ^ uVar14 ^ uVar38;
      uVar32 = uVar28 ^ uVar22;
      uVar36 = uVar17 ^ uVar14;
      uVar16 = uVar14 ^ uVar16;
      uVar4 = uVar24 ^ uVar26;
      uVar10 = uVar4 ^ uVar32;
      uVar29 = uVar25 ^ uVar22 ^ uVar4;
      uVar39 = uVar38 ^ uVar28 ^ uVar16;
      uVar12 = uVar29 ^ uVar36;
      uVar11 = (uVar25 ^ uVar22) & uVar22;
      uVar30 = (uVar12 ^ uVar10) & (uVar22 ^ uVar16) ^ uVar11;
      uVar11 = uVar39 & uVar16 ^ uVar11;
      uVar19 = uVar12 & uVar23;
      uVar38 = uVar29 & uVar24 ^ uVar38 ^ uVar28 ^ uVar11 ^ uVar19;
      uVar20 = uVar20 ^ uVar32;
      uVar21 = uVar10 & uVar20;
      uVar19 = uVar36 & (uVar13 ^ uVar14) ^ uVar25 ^ uVar19 ^ uVar30;
      uVar30 = uVar32 & uVar17 ^ uVar26 ^ uVar17 ^ uVar28 ^ uVar21 ^ uVar30;
      uVar11 = uVar18 & uVar4 ^ uVar26 ^ uVar21 ^ uVar22 ^ uVar11;
      uVar15 = uVar19 ^ uVar38;
      uVar19 = uVar19 & uVar30;
      uVar26 = (uVar19 ^ uVar11) & uVar15 ^ uVar38;
      uVar21 = (uVar38 ^ uVar19) & (uVar30 ^ uVar11);
      uVar38 = uVar21 ^ uVar11;
      uVar21 = (uVar21 ^ uVar19) & uVar11;
      uVar30 = uVar30 ^ uVar21;
      uVar15 = (uVar21 ^ uVar19 ^ uVar11) & uVar26 ^ uVar15;
      uVar19 = uVar30 ^ uVar38;
      uVar34 = uVar15 ^ uVar19;
      uVar21 = uVar19 & (uVar13 ^ uVar14);
      uVar14 = uVar26 ^ uVar38;
      uVar11 = uVar10 & (uVar15 ^ uVar26);
      uVar20 = (uVar15 ^ uVar26) & uVar20;
      uVar4 = uVar4 & uVar26;
      uVar33 = (uVar34 ^ uVar14) & (uVar22 ^ uVar16);
      uVar39 = uVar39 & uVar34;
      uVar28 = uVar15 & uVar17 ^ uVar39 ^ uVar14 & uVar25 ^ uVar20 ^ uVar33;
      uVar13 = uVar29 & uVar38 ^ uVar38 & uVar24;
      uVar31 = uVar28 ^ uVar11;
      uVar27 = uVar31 ^ uVar32 & uVar15;
      uVar28 = uVar28 ^ uVar12 & uVar30;
      uVar25 = uVar38 & uVar24 ^ uVar30 & uVar23 ^ uVar34 & uVar16;
      uVar31 = uVar31 ^ uVar4;
      uVar18 = uVar26 & uVar18 ^ uVar13 ^ uVar36 & uVar19 ^ uVar21 ^ uVar27;
      uVar27 = uVar39 ^ (uVar12 ^ uVar10) & (uVar34 ^ uVar14) ^ uVar27;
      uVar10 = uVar25 ^ uVar22 & uVar14;
      uVar14 = uVar15 & uVar17 ^ uVar18;
      uVar18 = uVar20 ^ uVar33 ^ uVar25 ^ uVar18;
      uVar38 = uVar29 & uVar38 ^ uVar28;
      uVar28 = uVar36 & uVar19 ^ uVar4 ^ uVar32 & uVar15 ^ uVar28;
      uVar4 = uVar13 ^ uVar4 ^ uVar12 & uVar30 ^ uVar21 ^ uVar34 & uVar16 ^ uVar11 ^ uVar33 ^ uVar27
      ;
      uVar12 = (uVar31 >> 8 ^ uVar31) & 0xcc00cc00cc00cc;
      uVar13 = (uVar18 >> 8 ^ uVar18) & 0xcc00cc00cc00cc;
      uVar25 = (uVar14 >> 8 ^ uVar14) & 0xcc00cc00cc00cc;
      uVar29 = (uVar38 >> 8 ^ uVar38) & 0xcc00cc00cc00cc;
      uVar21 = (uVar4 >> 8 ^ uVar4) & 0xcc00cc00cc00cc;
      uVar22 = (uVar28 >> 8 ^ uVar28) & 0xcc00cc00cc00cc;
      uVar11 = (uVar27 >> 8 ^ uVar27) & 0xcc00cc00cc00cc;
      uVar19 = (uVar10 >> 8 ^ uVar10) & 0xcc00cc00cc00cc;
      uVar31 = (uVar12 << 8 | uVar12) ^ uVar31;
      uVar18 = (uVar13 << 8 | uVar13) ^ uVar18;
      uVar14 = (uVar25 << 8 | uVar25) ^ uVar14;
      uVar38 = (uVar29 << 8 | uVar29) ^ uVar38;
      uVar4 = (uVar21 << 8 | uVar21) ^ uVar4;
      uVar28 = (uVar22 << 8 | uVar22) ^ uVar28;
      uVar27 = (uVar11 << 8 | uVar11) ^ uVar27;
      uVar10 = (uVar19 << 8 | uVar19) ^ uVar10;
      uVar25 = uVar27 & 0x5555555555555555 | (uVar27 & 0xaaa0aaa0aaa0aaa) << 4 |
               uVar27 >> 0xc & 0xa000a000a000a;
      uVar22 = uVar10 & 0x5555555555555555 | (uVar10 & 0xaaa0aaa0aaa0aaa) << 4 |
               uVar10 >> 0xc & 0xa000a000a000a;
      uVar4 = uVar4 & 0x5555555555555555 | (uVar4 & 0xaaa0aaa0aaa0aaa) << 4 |
              uVar4 >> 0xc & 0xa000a000a000a;
      uVar29 = uVar28 & 0x5555555555555555 | (uVar28 & 0xaaa0aaa0aaa0aaa) << 4 |
               uVar28 >> 0xc & 0xa000a000a000a;
      uVar21 = uVar14 & 0x5555555555555555 | (uVar14 & 0xaaa0aaa0aaa0aaa) << 4 |
               uVar14 >> 0xc & 0xa000a000a000a;
      uVar10 = uVar38 & 0x5555555555555555 | (uVar38 & 0xaaa0aaa0aaa0aaa) << 4 |
               uVar38 >> 0xc & 0xa000a000a000a;
      uVar19 = uVar31 & 0x5555555555555555 | (uVar31 & 0xaaa0aaa0aaa0aaa) << 4 |
               uVar31 >> 0xc & 0xa000a000a000a;
      uVar11 = uVar18 & 0x5555555555555555 | (uVar18 & 0xaaa0aaa0aaa0aaa) << 4 |
               uVar18 >> 0xc & 0xa000a000a000a;
      psVar5 = psVar5 + -8;
    }
    for (lVar9 = 0; lVar9 != 0x40; lVar9 = lVar9 + 0x10) {
      bVar6 = (byte)lVar9;
      uVar38 = uVar25 >> (bVar6 & 0x3f) & 0xffff |
               (ulong)(uint)((int)(uVar4 >> (bVar6 & 0x3f)) << 0x10) |
               (uVar21 >> (bVar6 & 0x3f) & 0xffff) << 0x20 | (uVar19 >> (bVar6 & 0x3f)) << 0x30;
      uVar12 = uVar22 >> (bVar6 & 0x3f) & 0xffff |
               (ulong)(uint)((int)(uVar29 >> (bVar6 & 0x3f)) << 0x10) |
               (uVar10 >> (bVar6 & 0x3f) & 0xffff) << 0x20 | (uVar11 >> (bVar6 & 0x3f)) << 0x30;
      uVar13 = (uVar12 >> 8 ^ uVar38) & 0xff00ff00ff00ff;
      uVar12 = uVar13 << 8 ^ uVar12;
      uVar13 = uVar13 ^ uVar38;
      uVar12 = (ulong)(((uint)(uVar12 >> 0x1c) ^ (uint)uVar12) & 0xf0f0f0f0) * 0x10000001 ^ uVar12;
      uVar13 = (ulong)(((uint)(uVar13 >> 0x1c) ^ (uint)uVar13) & 0xf0f0f0f0) * 0x10000001 ^ uVar13;
      uVar12 = ((uVar12 >> 0xe ^ uVar12) & 0xcccc0000cccc) * 0x4001 ^ uVar12;
      uVar13 = ((uVar13 >> 0xe ^ uVar13) & 0xcccc0000cccc) * 0x4001 ^ uVar13;
      PUT_64BIT_LSB_FIRST(data + lVar9,((uVar12 >> 7 ^ uVar12) & 0xaa00aa00aa00aa) * 0x81 ^ uVar12);
      PUT_64BIT_LSB_FIRST(data + lVar9 + 8,
                          ((uVar13 >> 7 ^ uVar13) & 0xaa00aa00aa00aa) * 0x81 ^ uVar13);
    }
    for (uVar4 = 0; __n != uVar4; uVar4 = uVar4 + 0x10) {
      vout = data + uVar4;
      memxor16(vout,vout,ciph + -0xb);
      psVar1 = (ssh_cipheralg *)((undefined8 *)((long)vblk + uVar4))[1];
      ciph[-0xb].vt = *(ssh_cipheralg **)((long)vblk + uVar4);
      ciph[-10].vt = psVar1;
      uVar2 = *(undefined8 *)(data + uVar4 + 8);
      *(undefined8 *)((long)vblk + uVar4) = *(undefined8 *)vout;
      ((undefined8 *)((long)vblk + uVar4))[1] = uVar2;
    }
    vblk = (void *)((long)vblk + __n);
  }
  smemclr(data,0x40);
  return;
}

Assistant:

static inline void aes_cbc_sw_decrypt(
    ssh_cipher *ciph, void *vblk, int blklen)
{
    aes_sw_context *ctx = container_of(ciph, aes_sw_context, ciph);
    uint8_t *blk = (uint8_t *)vblk;

    /*
     * CBC decryption can run in parallel, because all the
     * _ciphertext_ blocks are already available.
     */

    size_t blocks_remaining = blklen / 16;

    uint8_t data[SLICE_PARALLELISM * 16];
    /* Zeroing the data array is probably overcautious, but it avoids
     * technically undefined behaviour from leaving it uninitialised
     * if our very first iteration doesn't include enough cipher
     * blocks to populate it fully */
    memset(data, 0, sizeof(data));

    while (blocks_remaining > 0) {
        /* Number of blocks we'll handle in this iteration. If we're
         * dealing with fewer than the maximum, it doesn't matter -
         * it's harmless to run the full parallel cipher function
         * anyway. */
        size_t blocks = (blocks_remaining < SLICE_PARALLELISM ?
                         blocks_remaining : SLICE_PARALLELISM);

        /* Parallel-decrypt the input, in a separate array so we still
         * have the cipher stream available for XORing. */
        memcpy(data, blk, 16 * blocks);
        aes_sliced_d_parallel(data, data, &ctx->sk);

        /* Write the output and update the IV */
        for (size_t i = 0; i < blocks; i++) {
            uint8_t *decrypted = data + 16*i;
            uint8_t *output = blk + 16*i;

            memxor16(decrypted, decrypted, ctx->iv.cbc.prevblk);
            memcpy(ctx->iv.cbc.prevblk, output, 16);
            memcpy(output, decrypted, 16);
        }

        /* Advance the input pointer. */
        blk += 16 * blocks;
        blocks_remaining -= blocks;
    }

    smemclr(data, sizeof(data));
}